

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void returnSingleInt(Parse *pParse,char *zLabel,i64 value)

{
  int op;
  Vdbe *p;
  Vdbe *p_00;
  sqlite3 *in_RDX;
  int in_ESI;
  long in_RDI;
  i64 *pI64;
  int mem;
  Vdbe *v;
  int p1;
  int in_stack_ffffffffffffffcc;
  Parse *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  
  p = sqlite3GetVdbe(in_stack_ffffffffffffffd0);
  op = *(int *)(in_RDI + 0x54) + 1;
  *(int *)(in_RDI + 0x54) = op;
  p_00 = (Vdbe *)sqlite3DbMallocRaw((sqlite3 *)CONCAT44(op,in_stack_ffffffffffffffd8),
                                    (u64)in_stack_ffffffffffffffd0);
  if (p_00 != (Vdbe *)0x0) {
    p_00->db = in_RDX;
  }
  p1 = -0xd;
  sqlite3VdbeAddOp4(p,op,in_stack_ffffffffffffffd8,(int)((ulong)p_00 >> 0x20),(int)p_00,
                    (char *)CONCAT44(in_stack_ffffffffffffffcc,0xfffffff3),in_ESI);
  sqlite3VdbeSetNumCols(p,op);
  sqlite3VdbeSetColName
            ((Vdbe *)in_RDX,(int)((ulong)p >> 0x20),(int)p,
             (char *)CONCAT44(op,in_stack_ffffffffffffffd8),(_func_void_void_ptr *)p_00);
  sqlite3VdbeAddOp2(p_00,in_stack_ffffffffffffffcc,p1,0);
  return;
}

Assistant:

static void returnSingleInt(Parse *pParse, const char *zLabel, i64 value){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int mem = ++pParse->nMem;
  i64 *pI64 = sqlite3DbMallocRaw(pParse->db, sizeof(value));
  if( pI64 ){
    memcpy(pI64, &value, sizeof(value));
  }
  sqlite3VdbeAddOp4(v, OP_Int64, 0, mem, 0, (char*)pI64, P4_INT64);
  sqlite3VdbeSetNumCols(v, 1);
  sqlite3VdbeSetColName(v, 0, COLNAME_NAME, zLabel, SQLITE_STATIC);
  sqlite3VdbeAddOp2(v, OP_ResultRow, mem, 1);
}